

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

void bidiag_orth(double *A,int M,int N,double *U,double *V)

{
  size_t __size;
  int iVar1;
  int iVar2;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar3;
  int m;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int N_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  long local_e0;
  double *local_d8;
  long local_b8;
  long local_b0;
  double *local_98;
  double *local_68;
  
  if (N <= M) {
    uVar11 = (ulong)(uint)N;
    lVar13 = (long)M;
    __size = lVar13 * 8;
    x = (double *)malloc(__size);
    v = (double *)malloc(__size);
    A_00 = (double *)malloc(__size * lVar13);
    C = (double *)malloc(__size * lVar13);
    eye(U,M);
    eye(V,N);
    if (0 < N) {
      uVar14 = (ulong)(uint)M;
      local_e0 = uVar11 << 0x20;
      local_b0 = uVar14 << 0x20;
      local_d8 = A + uVar11;
      uVar4 = 0;
      uVar7 = uVar14;
      uVar12 = uVar11;
      local_98 = U;
      local_68 = A;
      local_b8 = local_e0;
      do {
        local_b8 = local_b8 + -0x100000000;
        if ((long)uVar4 < lVar13) {
          uVar5 = 0;
          pdVar3 = local_68;
          do {
            x[uVar5] = *pdVar3;
            uVar5 = uVar5 + 1;
            pdVar3 = pdVar3 + uVar11;
          } while (uVar7 != uVar5);
        }
        iVar1 = (int)uVar4;
        N_00 = M - iVar1;
        dVar15 = house(x,N_00,v);
        if ((long)uVar4 < lVar13) {
          lVar6 = 0;
          pdVar3 = local_68;
          uVar5 = uVar4;
          do {
            uVar8 = 0;
            lVar10 = lVar6;
            do {
              *(double *)((long)A_00 + (lVar10 >> 0x1d)) = pdVar3[uVar8];
              lVar10 = lVar10 + (uVar7 << 0x20);
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x100000000;
            pdVar3 = pdVar3 + uVar11;
          } while (uVar5 != uVar14);
        }
        m = N - iVar1;
        mmult(A_00,v,C,m,N_00,1);
        scale(C,N - iVar1,1,dVar15);
        mmult(v,C,A_00,N_00,1,m);
        if ((long)uVar4 < lVar13) {
          lVar6 = 0;
          pdVar3 = local_68;
          uVar5 = uVar4;
          do {
            uVar8 = 0;
            lVar10 = lVar6;
            do {
              pdVar3[uVar8] = pdVar3[uVar8] - *(double *)((long)A_00 + (lVar10 >> 0x1d));
              uVar8 = uVar8 + 1;
              lVar10 = lVar10 + 0x100000000;
            } while (uVar12 != uVar8);
            uVar5 = uVar5 + 1;
            pdVar3 = pdVar3 + uVar11;
            lVar6 = lVar6 + local_e0;
          } while (uVar5 != uVar14);
        }
        uVar5 = uVar4 + 1;
        if ((long)uVar5 < lVar13) {
          uVar8 = 1;
          pdVar3 = local_d8;
          do {
            *pdVar3 = v[uVar8];
            pdVar3 = pdVar3 + uVar11;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        if ((long)uVar4 < lVar13) {
          lVar6 = 0;
          pdVar3 = local_98;
          uVar8 = uVar4;
          do {
            uVar9 = 0;
            lVar10 = lVar6;
            do {
              *(double *)((long)A_00 + (lVar10 >> 0x1d)) = pdVar3[uVar9];
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x100000000;
            } while (uVar7 != uVar9);
            uVar8 = uVar8 + 1;
            pdVar3 = pdVar3 + lVar13;
            lVar6 = lVar6 + local_b0;
          } while (uVar8 != uVar14);
        }
        mmult(A_00,v,C,N_00,N_00,1);
        scale(C,N_00,1,dVar15);
        mmult(C,v,A_00,N_00,1,N_00);
        if ((long)uVar4 < lVar13) {
          lVar6 = 0;
          pdVar3 = local_98;
          uVar8 = uVar4;
          do {
            uVar9 = 0;
            lVar10 = lVar6;
            do {
              pdVar3[uVar9] = pdVar3[uVar9] - *(double *)((long)A_00 + (lVar10 >> 0x1d));
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x100000000;
            } while (uVar7 != uVar9);
            uVar8 = uVar8 + 1;
            pdVar3 = pdVar3 + lVar13;
            lVar6 = lVar6 + local_b0;
          } while (uVar8 != uVar14);
        }
        if ((long)uVar4 < (long)(N + -2)) {
          iVar2 = (N + 1) * iVar1;
          if (uVar5 < uVar11) {
            memcpy(x,A + (iVar2 + 1),(ulong)(uint)((N + -2) - iVar1) * 8 + 8);
          }
          dVar15 = house(x,(N - iVar1) + -1,v);
          if ((long)uVar4 < lVar13) {
            lVar6 = 0;
            pdVar3 = local_68;
            uVar8 = uVar4;
            do {
              if (uVar5 < uVar11) {
                uVar9 = 1;
                lVar10 = lVar6;
                do {
                  *(double *)((long)A_00 + (lVar10 >> 0x1d)) = pdVar3[uVar9];
                  uVar9 = uVar9 + 1;
                  lVar10 = lVar10 + 0x100000000;
                } while (uVar12 != uVar9);
              }
              uVar8 = uVar8 + 1;
              pdVar3 = pdVar3 + uVar11;
              lVar6 = lVar6 + local_b8;
            } while (uVar8 != uVar14);
          }
          mmult(A_00,v,C,N_00,m + -1,1);
          scale(C,N_00,1,dVar15);
          mmult(C,v,A_00,N_00,1,m + -1);
          if ((long)uVar4 < lVar13) {
            lVar6 = 0;
            pdVar3 = local_68;
            uVar8 = uVar4;
            do {
              if (uVar5 < uVar11) {
                uVar9 = 1;
                lVar10 = lVar6;
                do {
                  pdVar3[uVar9] = pdVar3[uVar9] - *(double *)((long)A_00 + (lVar10 >> 0x1d));
                  uVar9 = uVar9 + 1;
                  lVar10 = lVar10 + 0x100000000;
                } while (uVar12 != uVar9);
              }
              uVar8 = uVar8 + 1;
              pdVar3 = pdVar3 + uVar11;
              lVar6 = lVar6 + local_b8;
            } while (uVar8 != uVar14);
          }
          if (uVar4 + 2 < uVar11) {
            memcpy(A + (iVar2 + 2),v + 1,(ulong)(uint)((N + -3) - iVar1) * 8 + 8);
          }
        }
        uVar7 = uVar7 - 1;
        local_68 = local_68 + uVar11 + 1;
        uVar12 = uVar12 - 1;
        local_e0 = local_e0 + -0x100000000;
        local_d8 = local_d8 + uVar11 + 1;
        local_98 = local_98 + lVar13 + 1;
        local_b0 = local_b0 + -0x100000000;
        uVar4 = uVar5;
      } while (uVar5 != uVar11);
    }
    free(x);
    free(v);
    free(A_00);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void bidiag_orth(double *A, int M, int N,double *U,double *V) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * M);
	w = (double*) malloc(sizeof(double) * M * M);


	eye(U,M);
	eye(V,N);

	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);
		//mdisplay(v,M-j,1);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}


		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				AT[u+k-j] = U[k+t];
			}
		}

		mmult(AT,v,w,M-j,M-j,1);
		scale(w,M-j,1,beta);
		mmult(w,v,AT,M-j,1,M-j);

		for (i=j; i < M; i++) {
			t = i * M;
			u = (i-j) *(M-j);
			for (k=j; k < M; k++) {
				U[k+t] -= AT[u+k-j];
			}
		}

		//mdisplay(U,M,M);

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}